

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O0

Element * Rml::XMLParseTools::ParseTemplate(Element *element,String *template_name)

{
  Template *this;
  ElementDocument *this_00;
  String *filename;
  undefined8 uVar1;
  Template *parse_template;
  String *template_name_local;
  Element *element_local;
  
  this = TemplateCache::GetTemplate(template_name);
  if (this == (Template *)0x0) {
    this_00 = Element::GetOwnerDocument(element);
    filename = ElementDocument::GetSourceURL_abi_cxx11_(this_00);
    uVar1 = ::std::__cxx11::string::c_str();
    Log::ParseError(filename,-1,"Failed to find template \'%s\'.",uVar1);
    element_local = element;
  }
  else {
    element_local = Template::ParseTemplate(this,element);
  }
  return element_local;
}

Assistant:

Element* XMLParseTools::ParseTemplate(Element* element, const String& template_name)
{
	// Load the template, and parse it
	Template* parse_template = TemplateCache::GetTemplate(template_name);
	if (!parse_template)
	{
		Log::ParseError(element->GetOwnerDocument()->GetSourceURL(), -1, "Failed to find template '%s'.", template_name.c_str());
		return element;
	}

	return parse_template->ParseTemplate(element);
}